

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.c
# Opt level: O3

int verify_miniscript_or_d(miniscript_node_t *node,miniscript_node_t *parent)

{
  uint uVar1;
  uint uVar2;
  miniscript_node_t *pmVar3;
  miniscript_node_t *pmVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  
  iVar6 = 0;
  pmVar3 = node->child;
  for (pmVar4 = pmVar3; pmVar4 != (miniscript_node_t *)0x0; pmVar4 = pmVar4->next) {
    iVar6 = iVar6 + 1;
  }
  iVar5 = -2;
  if (iVar6 == node->info->inner_num) {
    uVar1 = pmVar3->type_properties;
    uVar2 = pmVar3->next->type_properties;
    uVar7 = (uVar2 & 0x5800 | uVar2 & uVar1 & 0xa100 | (~uVar1 & 0x1801) == 0 & uVar2) +
            (uVar2 * 2 & uVar1 & 0x200) + 0x20000;
    node->type_properties = uVar7;
    iVar5 = 0;
    if (((uVar1 >> 0xd & 1) != 0) && ((short)((ushort)uVar2 | (ushort)uVar1) < 0)) {
      node->type_properties = uVar7 | uVar2 & uVar1 & 0x10000;
    }
  }
  return iVar5;
}

Assistant:

static int verify_miniscript_or_d(struct miniscript_node_t *node, struct miniscript_node_t *parent)
{
    uint32_t x_prop, y_prop;
    int ret = verify_miniscript_two_param_check(node, parent);
    if (ret != WALLY_OK)
        return ret;

    x_prop = node->child->type_properties;
    y_prop = node->child->next->type_properties;
    node->type_properties = MINISCRIPT_PROPERTY_X;
    node->type_properties |= x_prop & y_prop &
                             (MINISCRIPT_PROPERTY_Z | MINISCRIPT_PROPERTY_E | MINISCRIPT_PROPERTY_S);
    node->type_properties |= y_prop &
                             (MINISCRIPT_PROPERTY_U | MINISCRIPT_PROPERTY_F | MINISCRIPT_PROPERTY_D);
    if (!(~x_prop & (MINISCRIPT_TYPE_B | MINISCRIPT_PROPERTY_D | MINISCRIPT_PROPERTY_U)))
        node->type_properties |= y_prop & MINISCRIPT_TYPE_B;
    if (y_prop & MINISCRIPT_PROPERTY_Z)
        node->type_properties |= x_prop & MINISCRIPT_PROPERTY_O;
    if ((x_prop & MINISCRIPT_PROPERTY_E) && ((x_prop | y_prop) & MINISCRIPT_PROPERTY_S))
        node->type_properties |= x_prop & y_prop & MINISCRIPT_PROPERTY_M;

    return WALLY_OK;
}